

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmImportedCxxModuleInfo.cxx
# Opt level: O1

string * __thiscall
ImportedCxxModuleLookup::BmiNameForSource
          (string *__return_storage_ptr__,ImportedCxxModuleLookup *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  iterator iVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view input;
  string_view input_00;
  string safename;
  cmCryptoHash hasher;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  cmCryptoHash local_90;
  string local_80;
  ImportedCxxModuleGeneratorInfo local_60;
  char *local_40;
  undefined8 local_38;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>_>_>
          ::find(&(this->GeneratorInfo)._M_t,path);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->GeneratorInfo)._M_t._M_impl.super__Rb_tree_header)
  {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>_>_>
            ::find(&(this->ImportedInfo)._M_t,path);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cmCryptoHash::cmCryptoHash(&local_90,AlgoSHA3_512);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->ImportedInfo)._M_t._M_impl.super__Rb_tree_header
       ) {
      input_00._M_str = (path->_M_dataplus)._M_p;
      input_00._M_len = path->_M_string_length;
      cmCryptoHash::HashString_abi_cxx11_(&local_b0,&local_90,input_00);
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_b0);
      local_60.BmiName._M_dataplus._M_p = (pointer)local_d0._M_string_length;
      local_60.BmiName._M_string_length = (size_type)local_d0._M_dataplus._M_p;
      local_60.BmiName.field_2._8_8_ = 4;
      local_40 = ".bmi";
      local_38 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_60;
      local_60.BmiName.field_2._M_allocated_capacity = (size_type)&local_d0;
      cmCatViews(&local_80,views_00);
    }
    else {
      input._M_str = *(char **)(iVar4._M_node + 2);
      input._M_len = (size_t)iVar4._M_node[2]._M_parent;
      cmCryptoHash::HashString_abi_cxx11_(&local_b0,&local_90,input);
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_b0);
      local_60.BmiName._M_dataplus._M_p = (pointer)local_d0._M_string_length;
      local_60.BmiName._M_string_length = (size_type)local_d0._M_dataplus._M_p;
      local_60.BmiName.field_2._8_8_ = 4;
      local_40 = ".bmi";
      local_38 = 0;
      views._M_len = 2;
      views._M_array = (iterator)&local_60;
      local_60.BmiName.field_2._M_allocated_capacity = (size_type)&local_d0;
      cmCatViews(&local_80,views);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_60.BmiName.field_2;
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_60.BmiName._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,ImportedCxxModuleGeneratorInfo>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>>
                *)&this->GeneratorInfo,path,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.BmiName._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.BmiName._M_dataplus._M_p,
                      (ulong)(local_60.BmiName.field_2._M_allocated_capacity + 1));
    }
    cmCryptoHash::~cmCryptoHash(&local_90);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar3._M_node + 2),
               (long)&(iVar3._M_node[2]._M_parent)->_M_color + *(long *)(iVar3._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImportedCxxModuleLookup::BmiNameForSource(std::string const& path)
{
  auto genit = this->GeneratorInfo.find(path);
  if (genit != this->GeneratorInfo.end()) {
    return genit->second.BmiName;
  }

  auto importit = this->ImportedInfo.find(path);
  std::string bmiName;
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
  constexpr size_t HASH_TRUNCATION = 12;
  if (importit != this->ImportedInfo.end()) {
    auto safename = hasher.HashString(importit->second.Name);
    bmiName = cmStrCat(safename.substr(0, HASH_TRUNCATION), ".bmi");
  } else {
    auto dirhash = hasher.HashString(path);
    bmiName = cmStrCat(dirhash.substr(0, HASH_TRUNCATION), ".bmi");
  }

  this->GeneratorInfo.emplace(path, ImportedCxxModuleGeneratorInfo{ bmiName });
  return bmiName;
}